

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O1

iterator * __thiscall
unodb::
db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::iterator::seek(iterator *this,art_key_type search_key,bool *match,bool fwd)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  undefined1 uVar4;
  undefined8 uVar5;
  uint uVar6;
  node_ptr nVar7;
  iterator *piVar8;
  stack_entry *psVar9;
  ulong uVar10;
  size_t __n;
  ulong uVar11;
  undefined7 in_register_00000081;
  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *pbVar12;
  node_type nVar13;
  ulong uVar14;
  byte *pbVar15;
  find_result fVar16;
  undefined1 local_c8 [8];
  iter_result_opt cnxt;
  undefined1 local_90 [8];
  iter_result_opt nxt;
  key_prefix_snapshot local_68;
  key_prefix_snapshot key_prefix;
  byte *local_58;
  byte *local_50;
  ulong local_48;
  node_ptr local_40;
  iterator *local_38;
  
  uVar10 = search_key.field_0._8_8_;
  key_prefix.u64._4_4_ = (undefined4)CONCAT71(in_register_00000081,fwd);
  if ((this->stack_).c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->stack_).c.
      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      std::
      deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
      ::pop_back(&(this->stack_).c);
    } while ((this->stack_).c.
             super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             (this->stack_).c.
             super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  (this->keybuf_).off = 0;
  *match = false;
  local_40.tagged_ptr = (this->db_->root).tagged_ptr;
  piVar8 = this;
  if (local_40.tagged_ptr != 0) {
    cnxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>.
    _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
    ._24_8_ = &this->stack_;
    nxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>.
    _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
    ._24_8_ = uVar10;
    local_50 = search_key.field_0._0_8_;
    local_48 = uVar10;
    do {
      uVar5 = nxt.
              super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
              _24_8_;
      pbVar12 = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                 *)(local_40.tagged_ptr & 0xfffffffffffffff8);
      nVar13 = (node_type)local_40.tagged_ptr & (I256|I48);
      if ((local_40.tagged_ptr & 7) == 0) {
        local_90 = (undefined1  [8])local_40.tagged_ptr;
        nxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
        _M_payload._M_value.node.tagged_ptr._0_2_ = 0xffff;
        nxt.super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
        _M_payload._8_8_ = 0;
        std::
        deque<unodb::detail::iter_result<unodb::detail::node_header>,std::allocator<unodb::detail::iter_result<unodb::detail::node_header>>>
        ::emplace_back<unodb::detail::iter_result<unodb::detail::node_header>>
                  ((deque<unodb::detail::iter_result<unodb::detail::node_header>,std::allocator<unodb::detail::iter_result<unodb::detail::node_header>>>
                    *)cnxt.
                      super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                      ._24_8_,(iter_result<unodb::detail::node_header> *)local_90);
        uVar14 = (ulong)*(uint *)&pbVar12->k_prefix;
        uVar11 = uVar10;
        if (uVar14 < uVar10) {
          uVar11 = uVar14;
        }
        uVar6 = memcmp(search_key.field_0._0_8_,&pbVar12->children_count,uVar11);
        if ((uVar6 == 0) && (uVar6 = 0, uVar14 != uVar10)) {
          uVar6 = -(uint)(uVar10 < uVar14) | 1;
        }
        if (uVar6 == 0) {
          *match = true;
LAB_0012d461:
          bVar3 = false;
          local_38 = this;
        }
        else {
          if (key_prefix.f.key_prefix._M_elems[4] == 0) {
            if (0 < (int)uVar6) goto LAB_0012d461;
            local_38 = prior(this);
          }
          else {
            if ((int)uVar6 < 0) goto LAB_0012d461;
            local_38 = next(this);
          }
          bVar3 = false;
        }
      }
      else {
        local_68.f = (inode_fields)(pbVar12->k_prefix).u64.value;
        uVar4 = local_68.f.key_prefix_length;
        uVar11 = (ulong)local_68.f.key_prefix_length;
        local_90 = (undefined1  [8])0x0;
        __n = 8;
        if ((ulong)nxt.
                   super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                   ._24_8_ < 8) {
          __n = nxt.
                super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                ._24_8_;
        }
        memcpy(local_90,local_50,__n);
        uVar6 = detail::key_prefix_snapshot::get_shared_length
                          ((key_prefix_snapshot *)&local_68.f,(uint64_t)local_90);
        uVar10 = local_48;
        if (uVar6 < (byte)uVar4) {
          if (local_68.f.key_prefix_length <= uVar6) {
            __assert_fail("i < length()",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                          ,0x248,
                          "auto unodb::detail::key_prefix_snapshot::operator[](std::size_t) const");
          }
          bVar1 = local_50[uVar6];
          bVar2 = *(byte *)((long)&local_68 + (ulong)uVar6);
          if (bVar1 == bVar2) {
            __assert_fail("cmp_ != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art.hpp"
                          ,0x4ce,
                          "typename db<Key, Value>::iterator &unodb::db<std::span<const std::byte>, std::span<const std::byte>>::iterator::seek(art_key_type, bool &, bool) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                         );
          }
          if (key_prefix.f.key_prefix._M_elems[4] == 0) {
            if (bVar1 < bVar2) {
              piVar8 = left_most_traversal(this,(node_ptr)local_40.tagged_ptr);
              local_38 = prior(piVar8);
            }
            else {
              local_38 = right_most_traversal(this,(node_ptr)local_40.tagged_ptr);
            }
          }
          else if (bVar1 < bVar2) {
            local_38 = left_most_traversal(this,(node_ptr)local_40.tagged_ptr);
          }
          else {
            piVar8 = right_most_traversal(this,(node_ptr)local_40.tagged_ptr);
            local_38 = next(piVar8);
          }
          bVar3 = false;
        }
        else {
          nxt.
          super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
          _24_8_ = uVar5 - uVar11;
          if ((ulong)uVar5 < uVar11) {
LAB_0012d6f1:
            __assert_fail("num_bytes <= key.size_bytes()",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                          ,0xc0,
                          "void unodb::detail::basic_art_key<std::span<const std::byte>>::shift_right(const std::size_t) [KeyType = std::span<const std::byte>]"
                         );
          }
          local_58 = local_50 + uVar11;
          bVar1 = local_50[uVar11];
          fVar16 = detail::
                   basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                   ::find_child(pbVar12,nVar13,bVar1);
          pbVar15 = local_58;
          if (fVar16.second ==
              (in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>
               *)0x0) {
            if (key_prefix.f.key_prefix._M_elems[4] == 0) {
              detail::
              basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
              ::lte_key_byte((iter_result_opt *)local_90,pbVar12,nVar13,*local_58);
              uVar10 = local_48;
              if (nxt.
                  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                  ._M_payload._16_1_ == '\0') {
                if ((this->stack_).c.
                    super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                    (this->stack_).c.
                    super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
                  pop(this);
                }
                do {
                  piVar8 = this;
                  if ((this->stack_).c.
                      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      (this->stack_).c.
                      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) break;
                  psVar9 = top(this);
                  uVar10 = (psVar9->node).tagged_ptr;
                  pbVar12 = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                             *)(uVar10 & 0xfffffffffffffff8);
                  nVar13 = (node_type)uVar10;
                  detail::
                  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                  ::prior((iter_result_opt *)local_c8,pbVar12,nVar13 & (I256|I48),
                          psVar9->child_index);
                  uVar4 = cnxt.
                          super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                          ._M_payload._16_1_;
                  if (cnxt.
                      super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                      ._M_payload._16_1_ == '\x01') {
                    nVar7 = detail::
                            basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                            ::get_child(pbVar12,nVar13 & (I256|I48),psVar9->child_index);
                    local_38 = right_most_traversal(this,(node_ptr)nVar7.tagged_ptr);
                  }
                  else {
                    pop(this);
                  }
                  pbVar15 = local_58;
                  uVar10 = local_48;
                  piVar8 = local_38;
                } while (uVar4 == '\0');
              }
              else {
                uVar4 = nxt.
                        super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                        ._M_payload._M_value.node.tagged_ptr._1_1_;
                nVar7 = detail::
                        basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                        ::get_child(pbVar12,nVar13,
                                    nxt.
                                    super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                                    ._M_payload.
                                    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                                    ._M_payload._M_value.node.tagged_ptr._1_1_);
                pbVar15 = local_58;
                push(this,(node_ptr)local_40.tagged_ptr,
                     nxt.
                     super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                     ._M_payload._M_value.node.tagged_ptr._0_1_,uVar4,
                     (key_prefix_snapshot)
                     nxt.
                     super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                     ._M_payload._8_8_);
                piVar8 = right_most_traversal(this,(node_ptr)nVar7.tagged_ptr);
              }
            }
            else {
              detail::
              basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
              ::gte_key_byte((iter_result_opt *)local_90,pbVar12,nVar13,*local_58);
              uVar10 = local_48;
              if (nxt.
                  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                  ._M_payload._16_1_ == '\0') {
                if ((this->stack_).c.
                    super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                    (this->stack_).c.
                    super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
                  pop(this);
                }
                do {
                  piVar8 = this;
                  if ((this->stack_).c.
                      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      (this->stack_).c.
                      super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) break;
                  psVar9 = top(this);
                  uVar10 = (psVar9->node).tagged_ptr;
                  pbVar12 = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                             *)(uVar10 & 0xfffffffffffffff8);
                  nVar13 = (node_type)uVar10;
                  detail::
                  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                  ::next((iter_result_opt *)local_c8,pbVar12,nVar13 & (I256|I48),psVar9->child_index
                        );
                  uVar4 = cnxt.
                          super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                          ._M_payload._16_1_;
                  if (cnxt.
                      super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                      ._M_payload._16_1_ == '\x01') {
                    nVar7 = detail::
                            basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                            ::get_child(pbVar12,nVar13 & (I256|I48),psVar9->child_index);
                    local_38 = left_most_traversal(this,(node_ptr)nVar7.tagged_ptr);
                  }
                  else {
                    pop(this);
                  }
                  pbVar15 = local_58;
                  uVar10 = local_48;
                  piVar8 = local_38;
                } while (uVar4 == '\0');
              }
              else {
                uVar4 = nxt.
                        super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                        ._M_payload._M_value.node.tagged_ptr._1_1_;
                nVar7 = detail::
                        basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                        ::get_child(pbVar12,nVar13,
                                    nxt.
                                    super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                                    ._M_payload.
                                    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                                    ._M_payload._M_value.node.tagged_ptr._1_1_);
                pbVar15 = local_58;
                push(this,(node_ptr)local_40.tagged_ptr,
                     nxt.
                     super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                     ._M_payload._M_value.node.tagged_ptr._0_1_,uVar4,
                     (key_prefix_snapshot)
                     nxt.
                     super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                     ._M_payload._8_8_);
                piVar8 = left_most_traversal(this,(node_ptr)nVar7.tagged_ptr);
              }
            }
            local_38 = piVar8;
            bVar3 = false;
            local_50 = pbVar15;
          }
          else {
            push(this,(node_ptr)local_40.tagged_ptr,bVar1,fVar16.first,local_68);
            if (nxt.
                super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                ._24_8_ == 0) goto LAB_0012d6f1;
            local_40.tagged_ptr = ((fVar16.second)->value).tagged_ptr;
            nxt.
            super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
            ._M_payload.
            super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
            _24_8_ = nxt.
                     super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
                     ._24_8_ + -1;
            bVar3 = true;
            uVar10 = local_48;
            local_50 = local_58 + 1;
          }
        }
      }
      piVar8 = local_38;
    } while (bVar3);
  }
  local_38 = piVar8;
  return local_38;
}

Assistant:

typename db<Key, Value>::iterator& db<Key, Value>::iterator::seek(
    art_key_type search_key, bool& match, bool fwd) {
  invalidate();   // invalidate the iterator (clear the stack).
  match = false;  // unless we wind up with an exact match.
  if (UNODB_DETAIL_UNLIKELY(db_.root == nullptr)) return *this;  // aka end()

  auto node{db_.root};
  const auto k = search_key;
  auto remaining_key{k};

  while (true) {
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      const auto* const leaf{node.template ptr<leaf_type*>()};
      push_leaf(node);
      const auto cmp_ = leaf->cmp(k);
      if (cmp_ == 0) {
        match = true;
        return *this;
      }
      if (fwd) {  // GTE semantics
        // if search_key < leaf, use the leaf, else next().
        return (cmp_ < 0) ? *this : next();
      }
      // LTE semantics: if search_key > leaf, use the leaf, else prior().
      return (cmp_ > 0) ? *this : prior();
    }
    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);
    auto* const inode{node.template ptr<inode_type*>()};  // some internal node.
    const auto key_prefix{inode->get_key_prefix().get_snapshot()};  // prefix
    const auto key_prefix_length{key_prefix.length()};  // length of that prefix
    const auto shared_length = key_prefix.get_shared_length(
        remaining_key.get_u64());  // #of prefix bytes matched.
    if (shared_length < key_prefix_length) {
      // We have visited an internal node whose prefix is longer than
      // the bytes in the key that we need to match.  To figure out
      // whether the search key would be located before or after the
      // current internal node, we need to compare the respective key
      // spans lexicographically.  Since we have [shared_length] bytes
      // in common, we know that the next byte will tell us the
      // relative ordering of the key vs the prefix. So now we compare
      // prefix and key and the first byte where they differ.
      const auto cmp_ = static_cast<int>(remaining_key[shared_length]) -
                        static_cast<int>(key_prefix[shared_length]);
      UNODB_DETAIL_ASSERT(cmp_ != 0);
      if (fwd) {
        if (cmp_ < 0) {
          // FWD and the search key is ordered before this node.  We
          // want the left-most leaf under the node.
          return left_most_traversal(node);
        }
        // FWD and the search key is ordered after this node.  Right
        // most descent and then next().
        return right_most_traversal(node).next();
      }
      // reverse traversal
      if (cmp_ < 0) {
        // REV and the search key is ordered before this node.  We
        // want the preceeding key.
        return left_most_traversal(node).prior();
      }
      // REV and the search key is ordered after this node.
      return right_most_traversal(node);
    }
    remaining_key.shift_right(key_prefix_length);
    const auto res = inode->find_child(node_type, remaining_key[0]);
    if (res.second == nullptr) {
      // We are on a key byte during the descent that is not mapped by
      // the current node.  Where we go next depends on whether we are
      // doing forward or reverse traversal.
      if (fwd) {
        // FWD: Take the next child_index that is mapped in the data
        // and then do a left-most descent to land on the key that is
        // the immediate successor of the desired key in the data.
        //
        // Note: We are probing with a key byte which does not appear
        // in our list of keys (this was verified above) so this will
        // always be the index the first entry whose key byte is
        // greater-than the probe value and [false] if there is no
        // such entry.
        //
        // Note: [node] has not been pushed onto the stack yet!
        auto nxt = inode->gte_key_byte(node_type, remaining_key[0]);
        if (!nxt) {
          // Pop entries off the stack until we find one with a
          // right-sibling of the path we took to this node and then
          // do a left-most descent under that right-sibling. If there
          // is no such parent, we will wind up with an empty stack
          // (aka the end() iterator) and return that state.
          if (!empty()) pop();
          while (!empty()) {
            const auto& centry = top();
            const auto cnode{centry.node};  // possible parent from the stack
            auto* const icnode{cnode.template ptr<inode_type*>()};
            const auto cnxt = icnode->next(
                cnode.type(), centry.child_index);  // right-sibling.
            if (cnxt) {
              auto nchild = icnode->get_child(cnode.type(), centry.child_index);
              return left_most_traversal(nchild);
            }
            pop();
          }
          return *this;  // stack is empty (aka end()).
        }
        const auto& tmp = nxt.value();  // unwrap.
        const auto child_index = tmp.child_index;
        const auto child = inode->get_child(node_type, child_index);
        push(node, tmp.key_byte, child_index, tmp.prefix);  // the path we took
        return left_most_traversal(child);  // left most traversal
      }
      // REV: Take the prior child_index that is mapped and then do
      // a right-most descent to land on the key that is the
      // immediate precessor of the desired key in the data.
      auto nxt = inode->lte_key_byte(node_type, remaining_key[0]);
      if (!nxt) {
        // Pop off the current entry until we find one with a
        // left-sibling and then do a right-most descent under that
        // left-sibling.  In the extreme case there is no such
        // previous entry and we will wind up with an empty stack.
        if (!empty()) pop();
        while (!empty()) {
          const auto& centry = top();
          const auto cnode{centry.node};  // possible parent from stack
          auto* const icnode{cnode.template ptr<inode_type*>()};
          const auto cnxt =
              icnode->prior(cnode.type(), centry.child_index);  // left-sibling.
          if (cnxt) {
            auto nchild = icnode->get_child(cnode.type(), centry.child_index);
            return right_most_traversal(nchild);
          }
          pop();
        }
        return *this;  // stack is empty (aka end()).
      }
      const auto& tmp = nxt.value();  // unwrap.
      const auto child_index{tmp.child_index};
      const auto child = inode->get_child(node_type, child_index);
      push(node, tmp.key_byte, child_index, tmp.prefix);  // the path we took
      return right_most_traversal(child);  // right most traversal
    }
    // Simple case. There is a child for the current key byte.
    const auto child_index{res.first};
    const auto* const child{res.second};
    push(node, remaining_key[0], child_index, key_prefix);
    node = *child;
    remaining_key.shift_right(1);
  }  // while ( true )
  UNODB_DETAIL_CANNOT_HAPPEN();
}